

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<std::__cxx11::string>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *needle,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *haystack)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult *pAVar4;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar5
  ;
  AssertionResult AVar6;
  AssertionResult local_60;
  char *local_50;
  char *local_48;
  char *needle_expr_local;
  char *haystack_expr_local;
  char *begin_string_quote;
  undefined8 uVar3;
  
  local_48 = needle_expr;
  needle_expr_local = haystack_expr;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (haystack,(needle->_M_dataplus)._M_p,0,needle->_M_string_length);
  bVar1 = (sVar2 != 0xffffffffffffffff) != expected_to_be_substring;
  uVar3 = CONCAT71((int7)(sVar2 >> 8),bVar1);
  if (bVar1) {
    haystack_expr_local = "\"";
    local_60.success_ = false;
    local_60.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar4 = AssertionResult::operator<<(&local_60,(char (*) [11])"Value of: ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_48);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [2])0x187520);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [11])0x186dfb);
    pAVar4 = AssertionResult::operator<<(pAVar4,&haystack_expr_local);
    pAVar4 = AssertionResult::operator<<(pAVar4,needle);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [3])0x1875d9);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [11])0x186e07);
    local_50 = "not ";
    if (expected_to_be_substring) {
      local_50 = "";
    }
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_50);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [16])"a substring of ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&needle_expr_local);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [2])0x187520);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [11])0x186db6);
    pAVar4 = AssertionResult::operator<<(pAVar4,&haystack_expr_local);
    pAVar4 = AssertionResult::operator<<(pAVar4,haystack);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [2])0x186ec8);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar4);
    internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_60.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar3 = extraout_RAX;
    sVar5.ptr_ = extraout_RDX_00;
  }
  else {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
    sVar5.ptr_ = extraout_RDX;
  }
  AVar6.message_.ptr_ = sVar5.ptr_;
  AVar6._0_8_ = uVar3;
  return AVar6;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"";
}